

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  cmMessenger *messenger;
  ostream *poVar6;
  cmGlobalGenerator *this_00;
  size_t sVar7;
  char *__s;
  ostringstream e;
  char *local_1e8;
  string local_1e0;
  undefined1 local_1c0 [112];
  ios_base local_150 [264];
  string local_48;
  
  tgtType = this->TargetTypeValue;
  local_1e8 = value;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace(this->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  if (!bVar3) {
    return;
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCOMPILE_DEFINITIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCOMPILE_FEATURES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                      propCOMPILE_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCUDA_PTX_COMPILATION_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCUDA_PTX_COMPILATION_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCUDA_PTX_COMPILATION_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propEXPORT_NAME_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
               "EXPORT_NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propEXPORT_NAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                      propIMPORTED_GLOBAL_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_
               ,"IMPORTED_GLOBAL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propINCLUDE_DIRECTORIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propLINK_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propLINK_DIRECTORIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propLINK_LIBRARIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::
       propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
    ._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propNAME_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
               "NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propSOURCES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
               "SOURCES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propSOURCES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propTYPE_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
               "TYPE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_);
  }
  sVar7 = prop->_M_string_length;
  if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_string_length) &&
     ((sVar7 == 0 ||
      (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                    SetProperty(std::__cxx11::string_const&,char_const*)::
                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0))
     )) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n",0x32);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
LAB_003335ca:
    local_48.field_2._M_allocated_capacity = local_1e0.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_1e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) goto LAB_003335e5;
  }
  else {
    if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.
                  _M_string_length) &&
       ((sVar7 == 0 ||
        (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                      SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.
                      _M_dataplus._M_p,sVar7), iVar5 == 0)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"NAME property is read-only\n",0x1b);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.
                  _M_string_length) &&
       ((sVar7 == 0 ||
        (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                      SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.
                      _M_dataplus._M_p,sVar7), iVar5 == 0)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"TYPE property is read-only\n",0x1b);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_.
                  _M_string_length) &&
       (((sVar7 == 0 ||
         (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                       SetProperty(std::__cxx11::string_const&,char_const*)::
                       propEXPORT_NAME_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)) &&
        (this->IsImportedTarget == true)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"EXPORT_NAME property can\'t be set on imported targets (\"",
                 0x38);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    if (((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_.
                   _M_string_length) &&
        ((sVar7 == 0 ||
         (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                       SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_.
                       _M_dataplus._M_p,sVar7), iVar5 == 0)))) && (this->IsImportedTarget == true))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"SOURCES property can\'t be set on imported targets (\"",0x34)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    if (((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                   propIMPORTED_GLOBAL_abi_cxx11_._M_string_length) &&
        ((sVar7 == 0 ||
         (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                       SetProperty(std::__cxx11::string_const&,char_const*)::
                       propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)))) &&
       (this->IsImportedTarget == false)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,
                 "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\"",0x40);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
       ((sVar7 == 0 ||
        (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                      SetProperty(std::__cxx11::string_const&,char_const*)::
                      propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)))) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->IncludeDirectoriesEntries,
                        (pcVar2->IncludeDirectoriesEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (this->Internal).Pointer,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,(value_type *)local_1c0);
LAB_00333a28:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
      return;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->CompileOptionsEntries,
                        (pcVar2->CompileOptionsEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->CompileOptionsBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->CompileOptionsEntries,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->CompileOptionsBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->CompileFeaturesEntries,
                        (pcVar2->CompileFeaturesEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->CompileFeaturesBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->CompileFeaturesEntries,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->CompileFeaturesBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->CompileDefinitionsEntries,
                        (pcVar2->CompileDefinitionsEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->CompileDefinitionsBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->CompileDefinitionsEntries,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propLINK_OPTIONS_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->LinkOptionsEntries,
                        (pcVar2->LinkOptionsEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->LinkOptionsBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->LinkOptionsEntries,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->LinkOptionsBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propLINK_DIRECTORIES_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->LinkDirectoriesEntries,
                        (pcVar2->LinkDirectoriesEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->LinkDirectoriesBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->LinkDirectoriesEntries,&local_1e8);
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->LinkDirectoriesBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->LinkImplementationPropertyEntries,
                        (pcVar2->LinkImplementationPropertyEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->LinkImplementationPropertyEntries,&local_1e8);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                 (value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propSOURCES_abi_cxx11_);
    if (_Var4) {
      pcVar2 = (this->Internal).Pointer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pcVar2->SourceEntries,
                        (pcVar2->SourceEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                (&((this->Internal).Pointer)->SourceBacktraces);
      if (local_1e8 == (char *)0x0) {
        return;
      }
      cmMakefile::GetBacktrace(this->Makefile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((this->Internal).Pointer)->SourceEntries,&local_1e8);
      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)local_1c0);
      goto LAB_00333a28;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propIMPORTED_GLOBAL_abi_cxx11_);
    if (_Var4) {
      bVar3 = cmSystemTools::IsOn(local_1e8);
      if (bVar3) {
        if (this->ImportedGloballyVisible != false) {
          return;
        }
        this->ImportedGloballyVisible = true;
        this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
        cmGlobalGenerator::IndexTarget(this_00,this);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,
                 "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\"",0x3c);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_003335ca;
    }
    iVar5 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
    if (iVar5 == 0) {
      __s = "";
      if (local_1e8 != (char *)0x0) {
        __s = local_1e8;
      }
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,__s,__s + sVar7);
      bVar3 = CheckImportedLibName(this,prop,&local_1e0);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    if ((iVar5 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      return;
    }
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propCUDA_PTX_COMPILATION_abi_cxx11_);
    if ((!_Var4) || (this->TargetTypeValue == OBJECT_LIBRARY)) {
      cmPropertyMap::SetProperty(&this->Properties,prop,local_1e8);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\"",0x46);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,(this->Name)._M_dataplus._M_p,
                        (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_003335e5;
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_003335e5:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->Internal->LinkOptionsEntries.clear();
    this->Internal->LinkOptionsBacktraces.clear();
    if (value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->Internal->LinkDirectoriesEntries.clear();
    this->Internal->LinkDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.emplace_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->Name << "\")\n";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->ImportedGloballyVisible) {
      this->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}